

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::AudioTrack::AudioTrack(AudioTrack *this,uint *seed)

{
  uint64 uVar1;
  
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__AudioTrack_005d11b8;
  (this->super_Track).codec_id_ = (char *)0x0;
  (this->super_Track).codec_private_ = (uint8_t *)0x0;
  (this->super_Track).language_ = (char *)0x0;
  (this->super_Track).max_block_additional_id_ = 0;
  (this->super_Track).name_ = (char *)0x0;
  (this->super_Track).number_ = 0;
  (this->super_Track).type_ = 0;
  uVar1 = MakeUID(seed);
  (this->super_Track).uid_ = uVar1;
  (this->super_Track).codec_delay_ = 0;
  (this->super_Track).seek_pre_roll_ = 0;
  (this->super_Track).default_duration_ = 0;
  (this->super_Track).codec_private_length_ = 0;
  *(undefined8 *)((long)&(this->super_Track).codec_private_length_ + 4) = 0;
  *(undefined8 *)((long)&(this->super_Track).content_encoding_entries_ + 4) = 0;
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__AudioTrack_005d1238;
  this->bit_depth_ = 0;
  this->channels_ = 1;
  this->sample_rate_ = 0.0;
  return;
}

Assistant:

AudioTrack::AudioTrack(unsigned int* seed)
    : Track(seed), bit_depth_(0), channels_(1), sample_rate_(0.0) {}